

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequestfactory.cpp
# Opt level: O1

void __thiscall
QNetworkRequestFactory::setBearerToken(QNetworkRequestFactory *this,QByteArray *token)

{
  QNetworkRequestFactoryPrivate *pQVar1;
  bool bVar2;
  
  bVar2 = ::operator==(&((this->d).d.ptr)->bearerToken,token);
  if (bVar2) {
    return;
  }
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QNetworkRequestFactoryPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QExplicitlySharedDataPointer<QNetworkRequestFactoryPrivate>::detach_helper(&this->d);
  }
  QByteArray::operator=(&((this->d).d.ptr)->bearerToken,token);
  return;
}

Assistant:

void QNetworkRequestFactory::setBearerToken(const QByteArray &token)
{
    if (d->bearerToken == token)
        return;

    d.detach();
    d->bearerToken = token;
}